

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O2

lzma_ret decode_buffer(lzma_coder_conflict5 *coder,uint8_t *in,size_t *in_pos,size_t in_size,
                      uint8_t *out,size_t *out_pos,size_t out_size)

{
  size_t *psVar1;
  size_t sVar2;
  uint8_t *puVar3;
  lzma_ret lVar4;
  ulong uVar5;
  size_t sVar6;
  ulong __n;
  ulong uVar7;
  size_t sVar8;
  
  psVar1 = &(coder->dict).pos;
  sVar6 = *out_pos;
  do {
    while( true ) {
      sVar8 = (coder->dict).pos;
      sVar2 = (coder->dict).size;
      if (sVar8 == sVar2) {
        *psVar1 = 0;
        sVar8 = 0;
      }
      uVar7 = out_size - sVar6;
      uVar5 = sVar2 - sVar8;
      if (uVar7 < uVar5) {
        uVar5 = uVar7;
      }
      (coder->dict).limit = uVar5 + sVar8;
      lVar4 = (*(coder->lz).code)((coder->lz).coder,&coder->dict,in,in_pos,in_size);
      uVar5 = (coder->dict).pos;
      __n = uVar5 - sVar8;
      if (uVar7 < __n) {
        __assert_fail("copy_size <= out_size - *out_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.c"
                      ,100,
                      "lzma_ret decode_buffer(lzma_coder *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      puVar3 = (coder->dict).buf;
      memcpy(out + sVar6,puVar3 + sVar8,__n);
      sVar6 = sVar6 + __n;
      *out_pos = sVar6;
      if ((coder->dict).need_reset == true) break;
      if (lVar4 != LZMA_OK) {
        return lVar4;
      }
      if (sVar6 == out_size) {
        return LZMA_OK;
      }
      if (uVar5 < (coder->dict).size) {
        return LZMA_OK;
      }
    }
    *psVar1 = 0;
    (coder->dict).full = 0;
    puVar3[(coder->dict).size - 1] = '\0';
    (coder->dict).need_reset = false;
    if (lVar4 != LZMA_OK) {
      return lVar4;
    }
  } while (sVar6 != out_size);
  return LZMA_OK;
}

Assistant:

static lzma_ret
decode_buffer(lzma_coder *coder,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size)
{
	while (true) {
		size_t copy_size;
		size_t dict_start;
		lzma_ret ret;

		// Wrap the dictionary if needed.
		if (coder->dict.pos == coder->dict.size)
			coder->dict.pos = 0;

		// Store the current dictionary position. It is needed to know
		// where to start copying to the out[] buffer.
		dict_start = coder->dict.pos;

		// Calculate how much we allow coder->lz.code() to decode.
		// It must not decode past the end of the dictionary
		// buffer, and we don't want it to decode more than is
		// actually needed to fill the out[] buffer.
		coder->dict.limit = coder->dict.pos
				+ my_min(out_size - *out_pos,
					coder->dict.size - coder->dict.pos);

		// Call the coder->lz.code() to do the actual decoding.
		ret = coder->lz.code(
				coder->lz.coder, &coder->dict,
				in, in_pos, in_size);

		// Copy the decoded data from the dictionary to the out[]
		// buffer.
		copy_size = coder->dict.pos - dict_start;
		assert(copy_size <= out_size - *out_pos);
		memcpy(out + *out_pos, coder->dict.buf + dict_start,
				copy_size);
		*out_pos += copy_size;

		// Reset the dictionary if so requested by coder->lz.code().
		if (coder->dict.need_reset) {
			lz_decoder_reset(coder);

			// Since we reset dictionary, we don't check if
			// dictionary became full.
			if (ret != LZMA_OK || *out_pos == out_size)
				return ret;
		} else {
			// Return if everything got decoded or an error
			// occurred, or if there's no more data to decode.
			//
			// Note that detecting if there's something to decode
			// is done by looking if dictionary become full
			// instead of looking if *in_pos == in_size. This
			// is because it is possible that all the input was
			// consumed already but some data is pending to be
			// written to the dictionary.
			if (ret != LZMA_OK || *out_pos == out_size
					|| coder->dict.pos < coder->dict.size)
				return ret;
		}
	}
}